

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O1

double duckdb::CheckReservoirQuantile(Value *quantile_val)

{
  BinderException *pBVar1;
  double dVar2;
  string local_40;
  
  if (quantile_val->is_null == true) {
    pBVar1 = (BinderException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"RESERVOIR_QUANTILE QUANTILE parameter cannot be NULL","");
    BinderException::BinderException(pBVar1,&local_40);
    __cxa_throw(pBVar1,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  dVar2 = Value::GetValue<double>(quantile_val);
  if ((0.0 <= dVar2) && (dVar2 <= 1.0)) {
    return dVar2;
  }
  pBVar1 = (BinderException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"RESERVOIR_QUANTILE can only take parameters in the range [0, 1]",
             "");
  BinderException::BinderException(pBVar1,&local_40);
  __cxa_throw(pBVar1,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static double CheckReservoirQuantile(const Value &quantile_val) {
	if (quantile_val.IsNull()) {
		throw BinderException("RESERVOIR_QUANTILE QUANTILE parameter cannot be NULL");
	}
	auto quantile = quantile_val.GetValue<double>();
	if (quantile < 0 || quantile > 1) {
		throw BinderException("RESERVOIR_QUANTILE can only take parameters in the range [0, 1]");
	}
	return quantile;
}